

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_lcp_3way_parallel<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  lcp_t *lcp_input0;
  size_t n0;
  lcp_t *lcp_input0_00;
  MergeResult MVar4;
  MergeResult MVar5;
  MergeResult MVar6;
  ostream *poVar7;
  uchar **ppuVar8;
  ulong uVar9;
  MergeResult MVar10;
  ulong uVar11;
  uchar **ppuVar12;
  lcp_t lVar13;
  char *__assertion;
  byte bVar14;
  uchar uVar15;
  byte bVar16;
  long lVar17;
  size_t sVar18;
  undefined1 auVar19 [16];
  double dVar20;
  char local_b9;
  long local_b8;
  uchar **local_b0;
  lcp_t *local_a8;
  size_t local_a0;
  lcp_t *local_98;
  uchar **local_90;
  lcp_t *local_88;
  uchar **local_80;
  lcp_t *local_78;
  uchar **local_70;
  lcp_t *local_68;
  uchar **local_60;
  lcp_t *local_58;
  MergeResult local_4c;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"mergesort_lcp_3way_parallel",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(): n=",6);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_b9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_b9,1);
  if (0x1f < n) {
    auVar19._8_4_ = (int)(n >> 0x20);
    auVar19._0_8_ = n;
    auVar19._12_4_ = 0x45300000;
    uVar11 = n / 3;
    dVar20 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
    uVar9 = (ulong)dVar20;
    uVar9 = (long)(dVar20 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
    local_a0 = n;
    local_4c = mergesort_lcp_3way_parallel<true>
                         (strings_input,strings_output,lcp_input,lcp_output,uVar11);
    local_90 = strings_input + uVar11;
    local_70 = strings_output + uVar11;
    local_98 = lcp_input + uVar11;
    local_78 = lcp_output + uVar11;
    local_38 = uVar9 - uVar11;
    MVar4 = mergesort_lcp_3way_parallel<true>(local_90,local_70,local_98,local_78,local_38);
    local_b8 = uVar9 * 8;
    local_80 = strings_input + uVar9;
    local_60 = strings_output + uVar9;
    local_88 = lcp_input + uVar9;
    local_68 = lcp_output + uVar9;
    local_40 = local_a0 - uVar9;
    local_b0 = strings_output;
    local_a8 = lcp_output;
    local_58 = lcp_input;
    MVar5 = mergesort_lcp_3way_parallel<true>(local_80,local_60,local_88,local_68,local_40);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"mergesort_lcp_3way_parallel",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(): m0=",7);
    MVar6 = local_4c;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", m1=",5);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,MVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", m2=",5);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,MVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    lcp_input0_00 = local_58;
    n0 = local_a0;
    MVar10 = MVar6;
    if (MVar6 != MVar4) {
      sVar18 = uVar11 * 8;
      if (MVar4 == MVar5) {
        local_48 = uVar11;
        if (MVar6 == SortedInPlace) {
          memcpy(local_b0,strings_input,sVar18);
          memcpy(local_a8,lcp_input0_00,sVar18);
        }
        else {
          memcpy(strings_input,local_b0,sVar18);
          memcpy(lcp_input0_00,local_a8,sVar18);
        }
        MVar6 = (MergeResult)(MVar6 == SortedInPlace);
        uVar11 = local_48;
        MVar10 = MVar4;
      }
      else if (MVar4 == SortedInPlace) {
        sVar18 = local_b8 + uVar11 * -8;
        MVar10 = SortedInTemp;
        if (sVar18 != 0) {
          memcpy(local_70,local_90,sVar18);
          memcpy(local_78,local_98,sVar18);
          MVar10 = SortedInTemp;
        }
      }
      else {
        sVar18 = local_b8 + uVar11 * -8;
        MVar10 = SortedInPlace;
        if (sVar18 != 0) {
          memcpy(local_90,local_70,sVar18);
          memcpy(local_98,local_78,sVar18);
          MVar10 = SortedInPlace;
        }
      }
    }
    if (MVar10 != MVar5) {
      if (MVar5 == SortedInPlace) {
        MVar5 = SortedInTemp;
        sVar18 = n0 * 8 - local_b8;
        if (sVar18 != 0) {
          memcpy(local_60,local_80,sVar18);
          memcpy(local_68,local_88,sVar18);
          MVar5 = SortedInTemp;
        }
      }
      else {
        MVar5 = SortedInPlace;
        sVar18 = n0 * 8 - local_b8;
        if (sVar18 != 0) {
          memcpy(local_80,local_60,sVar18);
          memcpy(local_88,local_68,sVar18);
          MVar5 = SortedInPlace;
        }
      }
    }
    lcp_input0 = local_a8;
    ppuVar8 = local_b0;
    if (MVar6 == MVar10) {
      if (MVar6 == MVar5) {
        if (MVar6 != SortedInPlace) {
          merge_lcp_3way<true>
                    (local_b0,local_a8,uVar11,local_70,local_78,local_38,local_60,local_68,local_40,
                     strings_input,lcp_input0_00);
          check_input(strings_input,lcp_input0_00,n0);
          return SortedInPlace;
        }
        merge_lcp_3way<true>
                  (strings_input,lcp_input0_00,uVar11,local_90,local_98,local_38,local_80,local_88,
                   local_40,local_b0,local_a8);
        check_input(ppuVar8,lcp_input0,n0);
        return SortedInTemp;
      }
      __assertion = "m1 == m2";
    }
    else {
      __assertion = "m0 == m1";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x397,
                  "MergeResult mergesort_lcp_3way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                 );
  }
  if (1 < n) {
    uVar11 = n & 0xffffffff;
    ppuVar8 = strings_input;
    do {
      pbVar1 = ppuVar8[1];
      ppuVar8 = ppuVar8 + 1;
      for (ppuVar12 = ppuVar8; strings_input < ppuVar12; ppuVar12 = ppuVar12 + -1) {
        pbVar2 = ppuVar12[-1];
        bVar14 = *pbVar2;
        bVar16 = *pbVar1;
        if (bVar14 != 0 && bVar14 == bVar16) {
          lVar17 = 1;
          do {
            bVar14 = pbVar2[lVar17];
            bVar16 = pbVar1[lVar17];
            if (bVar14 == 0) break;
            lVar17 = lVar17 + 1;
          } while (bVar14 == bVar16);
        }
        if (bVar14 <= bVar16) break;
        *ppuVar12 = pbVar2;
      }
      iVar3 = (int)uVar11;
      uVar11 = (ulong)(iVar3 - 1);
      *ppuVar12 = pbVar1;
    } while (2 < iVar3);
  }
  if (n != 1) {
    uVar11 = 0;
    do {
      uVar9 = uVar11 + 1 & 0xffffffff;
      uVar15 = *strings_input[uVar11];
      if (uVar15 == '\0') {
        lVar13 = 0;
      }
      else {
        lVar13 = 0;
        do {
          if (uVar15 != strings_input[uVar9][lVar13]) break;
          uVar15 = strings_input[uVar11][lVar13 + 1];
          lVar13 = lVar13 + 1;
        } while (uVar15 != '\0');
      }
      lcp_input[uVar11] = lVar13;
      uVar11 = uVar11 + 1;
    } while (uVar9 < n - 1);
  }
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_lcp_3way_parallel(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0, m1, m2;
#pragma omp task shared(m0)
	m0 = mergesort_lcp_3way_parallel<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
#pragma omp task shared(m1)
	m1 = mergesort_lcp_3way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
#pragma omp task shared(m2)
	m2 = mergesort_lcp_3way_parallel<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
#pragma omp taskwait
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}